

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O2

void __thiscall
irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::parseClosingXMLElement
          (CXMLReaderImpl<char,_irr::io::IXMLBase> *this)

{
  char *pcVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  string<char> local_30;
  
  this->CurrentNodeType = EXN_ELEMENT_END;
  this->IsEmptyElement = false;
  core::array<irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::SAttribute>::clear
            (&this->Attributes);
  pcVar1 = this->P;
  lVar2 = 1;
  do {
    lVar4 = lVar2;
    this->P = pcVar1 + lVar4;
    lVar2 = lVar4 + 1;
  } while (pcVar1[lVar4] != '>');
  while( true ) {
    lVar4 = lVar4 + -1;
    iVar3 = isspace((int)pcVar1[lVar4]);
    if (iVar3 == 0) break;
    this->P = pcVar1 + lVar4;
  }
  core::string<char>::string<char>(&local_30,pcVar1 + 1,(s32)lVar4);
  core::string<char>::operator=(&this->NodeName,&local_30);
  core::string<char>::~string(&local_30);
  this->P = this->P + 1;
  return;
}

Assistant:

void parseClosingXMLElement()
	{
		CurrentNodeType = EXN_ELEMENT_END;
		IsEmptyElement = false;
		Attributes.clear();

		++P;
		const char_type* pBeginClose = P;

		while(*P != L'>')
			++P;

    // remove trailing whitespace, if any
    while( std::isspace( P[-1]))
      --P;

		NodeName = core::string<char_type>(pBeginClose, (int)(P - pBeginClose));
		++P;
	}